

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall glslang::TIntermediate::promote(TIntermediate *this,TIntermOperator *node)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  if (node != (TIntermOperator *)0x0) {
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])(node);
    pp_Var1 = (node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    if (CONCAT44(extraout_var,iVar3) != 0) {
      iVar3 = (*pp_Var1[7])(node);
      bVar2 = promoteUnary(this,(TIntermUnary *)CONCAT44(extraout_var_00,iVar3));
      return bVar2;
    }
    iVar3 = (*pp_Var1[8])(node);
    pp_Var1 = (node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      iVar3 = (*pp_Var1[8])(node);
      bVar2 = promoteBinary(this,(TIntermBinary *)CONCAT44(extraout_var_02,iVar3));
      return bVar2;
    }
    iVar3 = (*pp_Var1[6])(node);
    if (CONCAT44(extraout_var_03,iVar3) != 0) {
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(node);
      bVar2 = promoteAggregate(this,(TIntermAggregate *)CONCAT44(extraout_var_04,iVar3));
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool TIntermediate::promote(TIntermOperator* node)
{
    if (node == nullptr)
        return false;

    if (node->getAsUnaryNode())
        return promoteUnary(*node->getAsUnaryNode());

    if (node->getAsBinaryNode())
        return promoteBinary(*node->getAsBinaryNode());

    if (node->getAsAggregate())
        return promoteAggregate(*node->getAsAggregate());

    return false;
}